

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_entry.c
# Opt level: O1

apx_portInstance_t *
apx_portConnectorChangeEntry_get(apx_portConnectorChangeEntry_t *self,int32_t index)

{
  int iVar1;
  apx_portInstance_t *paVar2;
  
  if ((self != (apx_portConnectorChangeEntry_t *)0x0) &&
     (iVar1 = self->count, -1 < index && iVar1 != 0)) {
    if ((iVar1 == 1) || (iVar1 == -1)) {
      if (index == 0) {
        return (self->data).port_instance;
      }
    }
    else if ((iVar1 < 0 && index < -iVar1) || (index < iVar1 && 0 < iVar1)) {
      paVar2 = (apx_portInstance_t *)adt_ary_value((self->data).array,index);
      return paVar2;
    }
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t *apx_portConnectorChangeEntry_get(apx_portConnectorChangeEntry_t *self, int32_t index)
{
   apx_portInstance_t *retval = (apx_portInstance_t*) 0;
   if ( (self != 0) && (self->count != 0) && (index >= 0) )
   {
      if ( (self->count == 1) || (self->count == -1) )
      {
         if (index == 0)
         {
            retval = self->data.port_instance;
         }
      }
      else
      {
         if ( ( (self->count < 0) && (index < -self->count) ) || ( (self->count > 0) && (index < self->count) ) )
         {
            retval = (apx_portInstance_t*) adt_ary_value(self->data.array, index);
         }
      }
   }
   return retval;
}